

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeCheckNode(RtreeCheck *pCheck,int iDepth,u8 *aParent,i64 iNode)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  sqlite3_stmt *psVar5;
  Mem *pVal;
  void *__src;
  ushort *__dest;
  i64 iKey;
  float fVar6;
  int iVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  uint uVar12;
  
  uVar9 = (ulong)(uint)iDepth;
  if ((pCheck->rc == 0) && (pCheck->pGetNode == (sqlite3_stmt *)0x0)) {
    psVar5 = rtreeCheckPrepare(pCheck,"SELECT data FROM %Q.\'%q_node\' WHERE nodeno=?",pCheck->zDb,
                               pCheck->zTab);
    pCheck->pGetNode = psVar5;
  }
  if (pCheck->rc == 0) {
    sqlite3_bind_int64(pCheck->pGetNode,1,iNode);
    iVar4 = sqlite3_step(pCheck->pGetNode);
    if (iVar4 == 100) {
      __dest = (ushort *)0x0;
      uVar12 = sqlite3_column_bytes(pCheck->pGetNode,0);
      psVar5 = pCheck->pGetNode;
      pVal = columnMem(psVar5,0);
      __src = sqlite3_value_blob(pVal);
      columnMallocFailure(psVar5);
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        __dest = (ushort *)sqlite3Malloc((long)(int)uVar12);
      }
      if (__dest == (ushort *)0x0) {
        pCheck->rc = 7;
        uVar12 = 0;
      }
      else {
        memcpy(__dest,__src,(long)(int)uVar12);
      }
    }
    else {
      uVar12 = 0;
      __dest = (ushort *)0x0;
    }
    iVar4 = sqlite3_reset(pCheck->pGetNode);
    if (pCheck->rc == 0) {
      pCheck->rc = iVar4;
    }
    if ((__dest == (ushort *)0x0) && (pCheck->rc == 0)) {
      __dest = (ushort *)0x0;
      rtreeCheckAppendMsg(pCheck,"Node %lld missing from database",iNode);
    }
  }
  else {
    uVar12 = 0;
    __dest = (ushort *)0x0;
  }
  if (__dest == (ushort *)0x0) {
    return;
  }
  if ((int)uVar12 < 4) {
    rtreeCheckAppendMsg(pCheck,"Node %lld is too small (%d bytes)",iNode,(ulong)uVar12);
  }
  else if ((aParent == (u8 *)0x0) &&
          (uVar3 = *__dest << 8 | *__dest >> 8, uVar9 = (ulong)uVar3, 0x28 < uVar3)) {
    rtreeCheckAppendMsg(pCheck,"Rtree depth out of range (%d)",uVar9);
  }
  else {
    uVar3 = __dest[1] << 8 | __dest[1] >> 8;
    if ((int)uVar12 < (int)((pCheck->nDim * 8 + 8) * (uint)uVar3 | 4)) {
      rtreeCheckAppendMsg(pCheck,"Node %lld is too small for cell count of %d (%d bytes)",iNode,
                          (ulong)uVar3,(ulong)uVar12);
    }
    else if (uVar3 != 0) {
      uVar12 = 0;
      do {
        iVar4 = pCheck->nDim;
        iVar7 = (iVar4 * 8 + 8) * uVar12;
        iKey = readInt64((u8 *)((long)__dest + (long)(iVar7 + 4)));
        if (0 < iVar4) {
          uVar10 = 0;
          do {
            uVar1 = *(uint *)((long)__dest + uVar10 * 8 + (long)iVar7 + 0xc);
            uVar2 = *(uint *)((long)__dest + uVar10 * 8 + (long)iVar7 + 0x10);
            fVar11 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18);
            fVar8 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
            if (pCheck->bInt == 0) {
              if (fVar8 < fVar11) goto LAB_001c8ec5;
            }
            else if ((int)fVar8 < (int)fVar11) {
LAB_001c8ec5:
              rtreeCheckAppendMsg(pCheck,"Dimension %d of cell %d on node %lld is corrupt",
                                  uVar10 & 0xffffffff,(ulong)uVar12,iNode);
            }
            if (aParent == (u8 *)0x0) goto LAB_001c8f50;
            uVar1 = *(uint *)(aParent + uVar10 * 8);
            uVar2 = *(uint *)(aParent + uVar10 * 8 + 4);
            fVar6 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18);
            if (pCheck->bInt == 0) {
              if (fVar6 <= fVar11) goto LAB_001c8f2c;
LAB_001c8f36:
              rtreeCheckAppendMsg(pCheck,
                                  "Dimension %d of cell %d on node %lld is corrupt relative to parent"
                                  ,uVar10 & 0xffffffff,(ulong)uVar12,iNode);
            }
            else {
              if ((int)fVar11 < (int)fVar6) goto LAB_001c8f36;
LAB_001c8f2c:
              fVar11 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              uVar2 << 0x18);
              if (pCheck->bInt == 0) {
                if (fVar11 < fVar8) goto LAB_001c8f36;
              }
              else if ((int)fVar11 < (int)fVar8) goto LAB_001c8f36;
            }
LAB_001c8f50:
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)pCheck->nDim);
        }
        if ((int)uVar9 < 1) {
          rtreeCheckMapping(pCheck,1,iKey,iNode);
          pCheck->nLeaf = pCheck->nLeaf + 1;
        }
        else {
          rtreeCheckMapping(pCheck,0,iKey,iNode);
          rtreeCheckNode(pCheck,(int)uVar9 + -1,(u8 *)((long)__dest + (long)(iVar7 + 4) + 8),iKey);
          pCheck->nNonLeaf = pCheck->nNonLeaf + 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar3);
    }
  }
  sqlite3_free(__dest);
  return;
}

Assistant:

static void rtreeCheckNode(
  RtreeCheck *pCheck,
  int iDepth,                     /* Depth of iNode (0==leaf) */
  u8 *aParent,                    /* Buffer containing parent coords */
  i64 iNode                       /* Node to check */
){
  u8 *aNode = 0;
  int nNode = 0;

  assert( iNode==1 || aParent!=0 );
  assert( pCheck->nDim>0 );

  aNode = rtreeCheckGetNode(pCheck, iNode, &nNode);
  if( aNode ){
    if( nNode<4 ){
      rtreeCheckAppendMsg(pCheck, 
          "Node %lld is too small (%d bytes)", iNode, nNode
      );
    }else{
      int nCell;                  /* Number of cells on page */
      int i;                      /* Used to iterate through cells */
      if( aParent==0 ){
        iDepth = readInt16(aNode);
        if( iDepth>RTREE_MAX_DEPTH ){
          rtreeCheckAppendMsg(pCheck, "Rtree depth out of range (%d)", iDepth);
          sqlite3_free(aNode);
          return;
        }
      }
      nCell = readInt16(&aNode[2]);
      if( (4 + nCell*(8 + pCheck->nDim*2*4))>nNode ){
        rtreeCheckAppendMsg(pCheck, 
            "Node %lld is too small for cell count of %d (%d bytes)", 
            iNode, nCell, nNode
        );
      }else{
        for(i=0; i<nCell; i++){
          u8 *pCell = &aNode[4 + i*(8 + pCheck->nDim*2*4)];
          i64 iVal = readInt64(pCell);
          rtreeCheckCellCoord(pCheck, iNode, i, &pCell[8], aParent);

          if( iDepth>0 ){
            rtreeCheckMapping(pCheck, 0, iVal, iNode);
            rtreeCheckNode(pCheck, iDepth-1, &pCell[8], iVal);
            pCheck->nNonLeaf++;
          }else{
            rtreeCheckMapping(pCheck, 1, iVal, iNode);
            pCheck->nLeaf++;
          }
        }
      }
    }
    sqlite3_free(aNode);
  }
}